

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

iterator __thiscall
pybind11::
make_iterator<(pybind11::return_value_policy)6,__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,ReadPath&>
          (pybind11 *this,
          __normal_iterator<ReadPath_*,_std::vector<ReadPath,_std::allocator<ReadPath>_>_> first,
          __normal_iterator<ReadPath_*,_std::vector<ReadPath,_std::allocator<ReadPath>_>_> last)

{
  type_info *ptVar1;
  class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,false,(pybind11::return_value_policy)6>>
  *this_00;
  object extraout_RDX;
  pair<const_void_*,_const_pybind11::detail::type_info_*> pVar2;
  iterator iVar3;
  return_value_policy local_43;
  type local_42;
  type local_41;
  object local_40;
  type_index local_38;
  ReadPath *local_30;
  undefined1 local_28;
  
  local_38._M_target =
       (type_info *)
       &detail::
        iterator_state<__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,false,(pybind11::return_value_policy)6>
        ::typeinfo;
  ptVar1 = detail::get_type_info(&local_38,false);
  if (ptVar1 == (type_info *)0x0) {
    local_40.super_handle.m_ptr._0_1_ = 1;
    class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<ReadPath_*,_std::vector<ReadPath,_std::allocator<ReadPath>_>_>,___gnu_cxx::__normal_iterator<ReadPath_*,_std::vector<ReadPath,_std::allocator<ReadPath>_>_>,_false,_(pybind11::return_value_policy)6>_>
    ::class_<pybind11::module_local>
              ((class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<ReadPath_*,_std::vector<ReadPath,_std::allocator<ReadPath>_>_>,___gnu_cxx::__normal_iterator<ReadPath_*,_std::vector<ReadPath,_std::allocator<ReadPath>_>_>,_false,_(pybind11::return_value_policy)6>_>
                *)&local_38,(handle)0x0,"iterator",(module_local *)&local_40);
    this_00 = (class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,false,(pybind11::return_value_policy)6>>
               *)class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,false,(pybind11::return_value_policy)6>>
                 ::
                 def<pybind11::make_iterator<(pybind11::return_value_policy)6,__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,ReadPath&>(__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>)::_lambda(pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,false,(pybind11::return_value_policy)6>&)_1_>
                           ((class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,false,(pybind11::return_value_policy)6>>
                             *)&local_38,"__iter__",&local_41);
    local_43 = reference_internal;
    class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,false,(pybind11::return_value_policy)6>>
    ::
    def<pybind11::make_iterator<(pybind11::return_value_policy)6,__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,ReadPath&>(__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>)::_lambda(pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,false,(pybind11::return_value_policy)6>&)_2_,pybind11::return_value_policy>
              (this_00,"__next__",&local_42,&local_43);
    object::~object((object *)&local_38);
  }
  local_28 = 1;
  local_38._M_target = (type_info *)first._M_current;
  local_30 = last._M_current;
  pVar2 = detail::type_caster_generic::src_and_type
                    (&local_38,
                     (type_info *)
                     &detail::
                      iterator_state<__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,__gnu_cxx::__normal_iterator<ReadPath*,std::vector<ReadPath,std::allocator<ReadPath>>>,false,(pybind11::return_value_policy)6>
                      ::typeinfo,(type_info *)0x0);
  local_40.super_handle =
       detail::type_caster_generic::cast
                 (pVar2.first,move,(handle)0x0,pVar2.second,
                  anon_func::anon_class_1_0_00000001::__invoke,
                  anon_func::anon_class_1_0_00000001::__invoke,(void *)0x0);
  iterator::iterator((iterator *)this,&local_40);
  object::~object(&local_40);
  iVar3.value.super_handle.m_ptr = extraout_RDX.super_handle.m_ptr;
  iVar3.super_object.super_handle.m_ptr = (handle)(handle)this;
  return iVar3;
}

Assistant:

iterator make_iterator(Iterator first, Sentinel last, Extra &&... extra) {
    using state = detail::iterator_state<Iterator, Sentinel, false, Policy>;

    if (!detail::get_type_info(typeid(state), false)) {
        class_<state>(handle(), "iterator", pybind11::module_local())
            .def("__iter__", [](state &s) -> state& { return s; })
            .def("__next__", [](state &s) -> ValueType {
                if (!s.first_or_done)
                    ++s.it;
                else
                    s.first_or_done = false;
                if (s.it == s.end) {
                    s.first_or_done = true;
                    throw stop_iteration();
                }
                return *s.it;
            }, std::forward<Extra>(extra)..., Policy);
    }

    return cast(state{first, last, true});
}